

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayoutInfo::separatorRect(QDockAreaLayoutInfo *this,int index)

{
  uint uVar1;
  bool bVar2;
  Representation RVar3;
  QSize QVar4;
  Representation RVar5;
  uint uVar6;
  ulong uVar7;
  QDockAreaLayoutItem *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  QRect QVar11;
  
  uVar10 = 0xffffffff00000000;
  uVar9 = 0xffffffff;
  if (this->tabbed == false) {
    this_00 = (this->item_list).d.ptr + index;
    bVar2 = QDockAreaLayoutItem::skip(this_00);
    if (!bVar2) {
      uVar6 = this_00->size + this_00->pos;
      bVar2 = this->o == Horizontal;
      uVar1 = (this->rect).x1.m_i;
      if (bVar2) {
        uVar1 = uVar6;
      }
      uVar8 = (ulong)uVar1;
      if (bVar2) {
        uVar6 = (this->rect).y1.m_i;
      }
      QVar4 = QRect::size(&this->rect);
      bVar2 = this->o == Horizontal;
      RVar3.m_i = QVar4.wd.m_i.m_i;
      if (bVar2) {
        RVar3.m_i = *this->sep;
      }
      RVar5.m_i = QVar4.ht.m_i.m_i;
      if (!bVar2) {
        RVar5.m_i = *this->sep;
      }
      uVar9 = (ulong)((uVar1 + RVar3.m_i) - 1);
      uVar7 = (ulong)uVar6 << 0x20;
      uVar10 = (ulong)((uVar6 + RVar5.m_i) - 1) << 0x20;
      goto LAB_003ca586;
    }
  }
  uVar7 = 0;
  uVar8 = 0;
LAB_003ca586:
  QVar11.x2.m_i = (int)(uVar10 | uVar9);
  QVar11.y2.m_i = (int)((uVar10 | uVar9) >> 0x20);
  QVar11.x1.m_i = (int)(uVar7 | uVar8);
  QVar11.y1.m_i = (int)((uVar7 | uVar8) >> 0x20);
  return QVar11;
}

Assistant:

QRect QDockAreaLayoutInfo::separatorRect(int index) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QRect();
#endif

    const QDockAreaLayoutItem &item = item_list.at(index);
    if (item.skip())
        return QRect();

    QPoint pos = rect.topLeft();
    rpick(o, pos) = item.pos + item.size;
    QSize s = rect.size();
    rpick(o, s) = *sep;

    return QRect(pos, s);
}